

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramPipelineBindingCase::iterate
          (ProgramPipelineBindingCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  allocator<char> local_149;
  ScopedLogSection section_1;
  string local_140;
  string local_120;
  CallLogWrapper gl;
  ScopedLogSection section;
  ProgramPipeline pipeline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  ScopedLogSection section_2;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140," // ERROR: ",(allocator<char> *)&local_120);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Initial",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Initial value",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_140,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  deqp::gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x825a,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"AfterBinding",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"After binding",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_140,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  glu::ProgramPipeline::ProgramPipeline(&pipeline,((this->super_TestCase).m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindProgramPipeline(&gl,pipeline.m_pipeline);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_149);
    section_2.m_log = (TestLog *)glu::getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&section_2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_b8,&local_98);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_120,"setup");
    tcu::ResultCollector::fail(&result,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (&result,&gl,0x825a,pipeline.m_pipeline,this->m_verifierType);
  glu::ProgramPipeline::~ProgramPipeline(&pipeline);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"AfterDelete",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"After deleting",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&section_2,pTVar1,&local_140,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  section_1.m_log._0_4_ = 0;
  glu::CallLogWrapper::glGenProgramPipelines(&gl,1,(GLuint *)&section_1);
  glu::CallLogWrapper::glBindProgramPipeline(&gl,(GLuint)section_1.m_log);
  glu::CallLogWrapper::glDeleteProgramPipelines(&gl,1,(GLuint *)&section_1);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_149);
    pipeline.m_gl = (Functions *)glu::getErrorName;
    pipeline.m_pipeline = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&pipeline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_b8,&local_98);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_140,&local_120,"setup");
    tcu::ResultCollector::fail(&result,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x825a,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

ProgramPipelineBindingCase::IterateResult ProgramPipelineBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial value");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterBinding", "After binding");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

		gl.glBindProgramPipeline(pipeline.getPipeline());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, pipeline.getPipeline(), m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterDelete", "After deleting");
		glw::GLuint					pipeline	= 0;

		gl.glGenProgramPipelines(1, &pipeline);
		gl.glBindProgramPipeline(pipeline);
		gl.glDeleteProgramPipelines(1, &pipeline);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}